

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::point3f>>::
initialize<tinyusdz::Animatable<tinyusdz::value::point3f>>
          (optional<tinyusdz::Animatable<tinyusdz::value::point3f>> *this,
          Animatable<tinyusdz::value::point3f> *value)

{
  undefined8 uVar1;
  pointer pSVar2;
  
  if (*this != (optional<tinyusdz::Animatable<tinyusdz::value::point3f>>)0x1) {
    uVar1 = *(undefined8 *)&value->_value;
    *(undefined8 *)(this + 0xe) = *(undefined8 *)((long)&(value->_value).y + 2);
    *(undefined8 *)(this + 8) = uVar1;
    pSVar2 = (value->_ts)._samples.
             super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(this + 0x18) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(this + 0x20) = pSVar2;
    *(pointer *)(this + 0x28) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::point3f>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this[0x30] = (optional<tinyusdz::Animatable<tinyusdz::value::point3f>>)(value->_ts)._dirty;
    *this = (optional<tinyusdz::Animatable<tinyusdz::value::point3f>>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::point3f>>::initialize(V &&) [T = tinyusdz::Animatable<tinyusdz::value::point3f>, V = tinyusdz::Animatable<tinyusdz::value::point3f>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }